

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_ge(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b)

{
  uint64_t *puVar1;
  int iVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint64_t mask1;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t mask0;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  secp256k1_fe *a_00;
  ulong uVar16;
  uint64_t uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint64_t uVar22;
  uint64_t uVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint64_t uVar28;
  uint64_t uVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  secp256k1_fe s2;
  secp256k1_fe u1;
  secp256k1_fe u2;
  secp256k1_fe zz;
  secp256k1_fe tt;
  undefined1 local_2e8 [16];
  undefined1 local_2c8 [16];
  secp256k1_fe local_238;
  secp256k1_fe local_208;
  secp256k1_fe local_1d8;
  secp256k1_fe local_1a8;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  ulong local_160;
  secp256k1_fe local_158;
  secp256k1_fe local_130;
  secp256k1_fe local_108;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  ulong local_b8;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  a_00 = &a->z;
  secp256k1_fe_sqr(&local_130,a_00);
  uVar3 = (a->x).n[4];
  uVar20 = (uVar3 >> 0x30) * 0x1000003d1 + (a->x).n[0];
  uVar13 = (uVar20 >> 0x34) + (a->x).n[1];
  uVar16 = (uVar13 >> 0x34) + (a->x).n[2];
  uVar20 = uVar20 & 0xfffffffffffff;
  uVar13 = uVar13 & 0xfffffffffffff;
  uVar14 = (uVar16 >> 0x34) + (a->x).n[3];
  uVar16 = uVar16 & 0xfffffffffffff;
  uVar17 = (uVar14 >> 0x34) + (uVar3 & 0xffffffffffff);
  uVar14 = uVar14 & 0xfffffffffffff;
  local_1a8.n[0] = uVar20;
  local_1a8.n[1] = uVar13;
  local_1a8.n[2] = uVar16;
  local_1a8.n[3] = uVar14;
  local_1a8.n[4] = uVar17;
  secp256k1_fe_mul(&local_158,&b->x,&local_130);
  uVar3 = (a->y).n[4];
  uVar19 = (uVar3 >> 0x30) * 0x1000003d1 + (a->y).n[0];
  uVar9 = (uVar19 >> 0x34) + (a->y).n[1];
  uVar10 = (uVar9 >> 0x34) + (a->y).n[2];
  uVar11 = (uVar10 >> 0x34) + (a->y).n[3];
  secp256k1_fe_mul(&local_1d8,&b->y,&local_130);
  secp256k1_fe_mul(&local_1d8,&local_1d8,a_00);
  local_208.n[0] = local_1a8.n[0] + local_158.n[0];
  local_208.n[1] = local_1a8.n[1] + local_158.n[1];
  local_208.n[2] = local_1a8.n[2] + local_158.n[2];
  local_208.n[3] = local_1a8.n[3] + local_158.n[3];
  local_208.n[4] = local_1a8.n[4] + local_158.n[4];
  lVar15 = (uVar11 >> 0x34) + (uVar3 & 0xffffffffffff);
  uVar12 = local_1d8.n[4] + lVar15;
  secp256k1_fe_sqr(&local_108,&local_208);
  local_238.n[0] = 0x3ffffbfffff0bc - local_158.n[0];
  local_238.n[1] = 0x3ffffffffffffc - local_158.n[1];
  local_238.n[2] = 0x3ffffffffffffc - local_158.n[2];
  local_238.n[3] = 0x3ffffffffffffc - local_158.n[3];
  local_238.n[4] = 0x3fffffffffffc - local_158.n[4];
  secp256k1_fe_mul(&local_a8,&local_1a8,&local_238);
  uVar22 = local_108.n[0] + local_a8.n[0];
  uVar27 = local_108.n[1] + local_a8.n[1];
  uVar28 = local_108.n[2] + local_a8.n[2];
  uVar30 = local_108.n[3] + local_a8.n[3];
  uVar21 = local_108.n[4] + local_a8.n[4];
  local_108.n[0] = uVar22;
  local_108.n[1] = uVar27;
  local_108.n[2] = uVar28;
  local_108.n[3] = uVar30;
  local_108.n[4] = uVar21;
  uVar6 = secp256k1_fe_normalizes_to_zero(&local_108);
  uVar10 = uVar10 & 0xfffffffffffff;
  uVar11 = uVar11 & 0xfffffffffffff;
  uVar19 = uVar19 & 0xfffffffffffff;
  uVar9 = uVar9 & 0xfffffffffffff;
  local_2e8._0_8_ = uVar19 + local_1d8.n[0];
  local_2e8._8_8_ = uVar9 + local_1d8.n[1];
  local_2c8._0_8_ = uVar10 + local_1d8.n[2];
  local_2c8._8_8_ = uVar11 + local_1d8.n[3];
  local_58.n[0] = local_2e8._0_8_;
  local_58.n[1] = local_2e8._8_8_;
  local_58.n[2] = local_2c8._0_8_;
  local_58.n[3] = local_2c8._8_8_;
  local_58.n[4] = uVar12;
  uVar7 = secp256k1_fe_normalizes_to_zero(&local_58);
  uVar7 = uVar7 & uVar6;
  uVar3 = (ulong)(uVar7 ^ 1) - 1;
  uVar18 = -(ulong)(uVar7 ^ 1);
  auVar23._8_4_ = (int)uVar3;
  auVar23._0_8_ = uVar3;
  auVar23._12_4_ = (int)(uVar3 >> 0x20);
  auVar32._8_8_ = uVar11 * 2;
  auVar32._0_8_ = uVar10 * 2;
  auVar29._8_8_ = uVar9 * 2;
  auVar29._0_8_ = uVar19 * 2;
  auVar24._8_4_ = (int)uVar18;
  auVar24._0_8_ = uVar18;
  auVar24._12_4_ = (int)(uVar18 >> 0x20);
  auVar4._8_8_ = uVar30;
  auVar4._0_8_ = uVar28;
  local_170 = auVar4 & auVar24 | auVar32 & auVar23;
  auVar5._8_8_ = uVar27;
  auVar5._0_8_ = uVar22;
  local_180 = auVar5 & auVar24 | auVar29 & auVar23;
  local_160 = uVar21 & uVar18 | lVar15 * 2 & uVar3;
  local_238.n[0] = local_2e8._0_8_ & uVar18 | (0x3ffffbfffff0bc - local_158.n[0]) + uVar20 & uVar3;
  local_238.n[1] = local_2e8._8_8_ & uVar18 | (0x3ffffffffffffc - local_158.n[1]) + uVar13 & uVar3;
  local_238.n[2] = local_2c8._0_8_ & uVar18 | (0x3ffffffffffffc - local_158.n[2]) + uVar16 & uVar3;
  local_238.n[3] = local_2c8._8_8_ & uVar18 | (0x3ffffffffffffc - local_158.n[3]) + uVar14 & uVar3;
  local_238.n[4] = uVar18 & uVar12 | (0x3fffffffffffc - local_158.n[4]) + uVar17 & uVar3;
  secp256k1_fe_sqr((secp256k1_fe *)local_d8,&local_238);
  secp256k1_fe_mul(&local_80,(secp256k1_fe *)local_d8,&local_208);
  secp256k1_fe_sqr((secp256k1_fe *)local_d8,(secp256k1_fe *)local_d8);
  uVar3 = (ulong)uVar7 - 1;
  uVar16 = -(ulong)uVar7;
  auVar25._8_4_ = (int)uVar3;
  auVar25._0_8_ = uVar3;
  auVar25._12_4_ = (int)(uVar3 >> 0x20);
  auVar31._8_4_ = (int)uVar16;
  auVar31._0_8_ = uVar16;
  auVar31._12_4_ = (int)(uVar16 >> 0x20);
  auVar32 = local_2e8 & auVar31 | local_d8 & auVar25;
  auVar29 = local_2c8 & auVar31 | auVar25 & local_c8;
  secp256k1_fe_sqr(&local_208,(secp256k1_fe *)local_180);
  secp256k1_fe_mul(&r->z,a_00,&local_238);
  iVar8 = secp256k1_fe_normalizes_to_zero(&r->z);
  iVar2 = a->infinity;
  uVar17 = (r->z).n[1];
  uVar22 = (r->z).n[2];
  uVar27 = (r->z).n[3];
  (r->z).n[0] = (r->z).n[0] * 2;
  (r->z).n[1] = uVar17 * 2;
  (r->z).n[2] = uVar22 * 2;
  (r->z).n[3] = uVar27 * 2;
  puVar1 = (r->z).n + 4;
  *puVar1 = *puVar1 << 1;
  uVar13 = local_208.n[4] + (0x3fffffffffffc - local_80.n[4]);
  uVar9 = (uVar13 >> 0x30) * 0x1000003d1 + local_208.n[0] + (0x3ffffbfffff0bc - local_80.n[0]);
  uVar10 = (uVar9 >> 0x34) + local_208.n[1] + (0x3ffffffffffffc - local_80.n[1]);
  uVar11 = (uVar10 >> 0x34) + local_208.n[2] + (0x3ffffffffffffc - local_80.n[2]);
  uVar14 = (uVar11 >> 0x34) + local_208.n[3] + (0x3ffffffffffffc - local_80.n[3]);
  uVar17 = (uVar14 >> 0x34) + (uVar13 & 0xffffffffffff);
  uVar9 = uVar9 & 0xfffffffffffff;
  uVar10 = uVar10 & 0xfffffffffffff;
  uVar11 = uVar11 & 0xfffffffffffff;
  uVar14 = uVar14 & 0xfffffffffffff;
  (r->x).n[4] = uVar17;
  (r->x).n[2] = uVar11;
  (r->x).n[3] = uVar14;
  (r->x).n[0] = uVar9;
  (r->x).n[1] = uVar10;
  local_208.n[0] = (0x3ffffbfffff0bc - local_80.n[0]) + uVar9 * 2;
  local_208.n[1] = (0x3ffffffffffffc - local_80.n[1]) + uVar10 * 2;
  local_208.n[2] = (0x3ffffffffffffc - local_80.n[2]) + uVar11 * 2;
  local_208.n[3] = (0x3ffffffffffffc - local_80.n[3]) + uVar14 * 2;
  local_208.n[4] = (0x3fffffffffffc - local_80.n[4]) + uVar17 * 2;
  secp256k1_fe_mul(&local_208,&local_208,(secp256k1_fe *)local_180);
  local_2e8._0_8_ = auVar32._0_8_;
  local_2e8._8_8_ = auVar32._8_8_;
  local_2c8._0_8_ = auVar29._0_8_;
  local_2c8._8_8_ = auVar29._8_8_;
  (r->y).n[0] = 0x7ffff7ffffe178 - (local_2e8._0_8_ + local_208.n[0]);
  (r->y).n[1] = 0x7ffffffffffff8 - (local_2e8._8_8_ + local_208.n[1]);
  (r->y).n[2] = 0x7ffffffffffff8 - (local_2c8._0_8_ + local_208.n[2]);
  (r->y).n[3] = 0x7ffffffffffff8 - (local_2c8._8_8_ + local_208.n[3]);
  (r->y).n[4] = 0x7fffffffffff8 - ((uVar16 & uVar12 | uVar3 & local_b8) + local_208.n[4]);
  secp256k1_fe_normalize_weak(&r->y);
  uVar17 = (r->x).n[1];
  uVar19 = (r->x).n[0] << 2;
  (r->x).n[0] = uVar19;
  uVar18 = uVar17 << 2;
  (r->x).n[1] = uVar18;
  uVar20 = (r->x).n[2] << 2;
  (r->x).n[2] = uVar20;
  uVar16 = (r->x).n[3] << 2;
  (r->x).n[3] = uVar16;
  uVar14 = (r->x).n[4] << 2;
  (r->x).n[4] = uVar14;
  uVar13 = (r->y).n[0] << 2;
  (r->y).n[0] = uVar13;
  uVar12 = (r->y).n[1] << 2;
  (r->y).n[1] = uVar12;
  uVar11 = (r->y).n[2] << 2;
  (r->y).n[2] = uVar11;
  uVar10 = (r->y).n[3] << 2;
  (r->y).n[3] = uVar10;
  uVar21 = (r->y).n[4] << 2;
  (r->y).n[4] = uVar21;
  uVar3 = (long)a->infinity - 1;
  uVar9 = -(long)a->infinity;
  (r->x).n[0] = (b->x).n[0] & uVar9 | uVar19 & uVar3;
  (r->x).n[1] = (b->x).n[1] & uVar9 | uVar18 & uVar3;
  (r->x).n[2] = (b->x).n[2] & uVar9 | uVar20 & uVar3;
  (r->x).n[3] = (b->x).n[3] & uVar9 | uVar16 & uVar3;
  (r->x).n[4] = (b->x).n[4] & uVar9 | uVar14 & uVar3;
  (r->y).n[0] = (b->y).n[0] & uVar9 | uVar13 & uVar3;
  (r->y).n[1] = (b->y).n[1] & uVar9 | uVar12 & uVar3;
  (r->y).n[2] = (b->y).n[2] & uVar9 | uVar11 & uVar3;
  (r->y).n[3] = (b->y).n[3] & uVar9 | uVar10 & uVar3;
  (r->y).n[4] = (b->y).n[4] & uVar9 | uVar21 & uVar3;
  (r->z).n[0] = (ulong)((uint)uVar9 & 1) | uVar3 & (r->z).n[0];
  auVar26._8_4_ = (int)uVar3;
  auVar26._0_8_ = uVar3;
  auVar26._12_4_ = (int)(uVar3 >> 0x20);
  *(undefined1 (*) [16])((r->z).n + 1) = *(undefined1 (*) [16])((r->z).n + 1) & auVar26;
  *(undefined1 (*) [16])((r->z).n + 3) = *(undefined1 (*) [16])((r->z).n + 3) & auVar26;
  r->infinity = (1 - iVar2) * iVar8;
  return;
}

Assistant:

static void secp256k1_gej_add_ge(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b) {
    /* Operations: 7 mul, 5 sqr, 4 normalize, 21 mul_int/add/negate/cmov */
    static const secp256k1_fe fe_1 = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 1);
    secp256k1_fe zz, u1, u2, s1, s2, t, tt, m, n, q, rr;
    secp256k1_fe m_alt, rr_alt;
    int infinity, degenerate;
    VERIFY_CHECK(!b->infinity);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);

    /** In:
     *    Eric Brier and Marc Joye, Weierstrass Elliptic Curves and Side-Channel Attacks.
     *    In D. Naccache and P. Paillier, Eds., Public Key Cryptography, vol. 2274 of Lecture Notes in Computer Science, pages 335-345. Springer-Verlag, 2002.
     *  we find as solution for a unified addition/doubling formula:
     *    lambda = ((x1 + x2)^2 - x1 * x2 + a) / (y1 + y2), with a = 0 for secp256k1's curve equation.
     *    x3 = lambda^2 - (x1 + x2)
     *    2*y3 = lambda * (x1 + x2 - 2 * x3) - (y1 + y2).
     *
     *  Substituting x_i = Xi / Zi^2 and yi = Yi / Zi^3, for i=1,2,3, gives:
     *    U1 = X1*Z2^2, U2 = X2*Z1^2
     *    S1 = Y1*Z2^3, S2 = Y2*Z1^3
     *    Z = Z1*Z2
     *    T = U1+U2
     *    M = S1+S2
     *    Q = T*M^2
     *    R = T^2-U1*U2
     *    X3 = 4*(R^2-Q)
     *    Y3 = 4*(R*(3*Q-2*R^2)-M^4)
     *    Z3 = 2*M*Z
     *  (Note that the paper uses xi = Xi / Zi and yi = Yi / Zi instead.)
     *
     *  This formula has the benefit of being the same for both addition
     *  of distinct points and doubling. However, it breaks down in the
     *  case that either point is infinity, or that y1 = -y2. We handle
     *  these cases in the following ways:
     *
     *    - If b is infinity we simply bail by means of a VERIFY_CHECK.
     *
     *    - If a is infinity, we detect this, and at the end of the
     *      computation replace the result (which will be meaningless,
     *      but we compute to be constant-time) with b.x : b.y : 1.
     *
     *    - If a = -b, we have y1 = -y2, which is a degenerate case.
     *      But here the answer is infinity, so we simply set the
     *      infinity flag of the result, overriding the computed values
     *      without even needing to cmov.
     *
     *    - If y1 = -y2 but x1 != x2, which does occur thanks to certain
     *      properties of our curve (specifically, 1 has nontrivial cube
     *      roots in our field, and the curve equation has no x coefficient)
     *      then the answer is not infinity but also not given by the above
     *      equation. In this case, we cmov in place an alternate expression
     *      for lambda. Specifically (y1 - y2)/(x1 - x2). Where both these
     *      expressions for lambda are defined, they are equal, and can be
     *      obtained from each other by multiplication by (y1 + y2)/(y1 + y2)
     *      then substitution of x^3 + 7 for y^2 (using the curve equation).
     *      For all pairs of nonzero points (a, b) at least one is defined,
     *      so this covers everything.
     */

    secp256k1_fe_sqr(&zz, &a->z);                       /* z = Z1^2 */
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);        /* u1 = U1 = X1*Z2^2 (1) */
    secp256k1_fe_mul(&u2, &b->x, &zz);                  /* u2 = U2 = X2*Z1^2 (1) */
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);        /* s1 = S1 = Y1*Z2^3 (1) */
    secp256k1_fe_mul(&s2, &b->y, &zz);                  /* s2 = Y2*Z1^2 (1) */
    secp256k1_fe_mul(&s2, &s2, &a->z);                  /* s2 = S2 = Y2*Z1^3 (1) */
    t = u1; secp256k1_fe_add(&t, &u2);                  /* t = T = U1+U2 (2) */
    m = s1; secp256k1_fe_add(&m, &s2);                  /* m = M = S1+S2 (2) */
    secp256k1_fe_sqr(&rr, &t);                          /* rr = T^2 (1) */
    secp256k1_fe_negate(&m_alt, &u2, 1);                /* Malt = -X2*Z1^2 */
    secp256k1_fe_mul(&tt, &u1, &m_alt);                 /* tt = -U1*U2 (2) */
    secp256k1_fe_add(&rr, &tt);                         /* rr = R = T^2-U1*U2 (3) */
    /** If lambda = R/M = 0/0 we have a problem (except in the "trivial"
     *  case that Z = z1z2 = 0, and this is special-cased later on). */
    degenerate = secp256k1_fe_normalizes_to_zero(&m) &
                 secp256k1_fe_normalizes_to_zero(&rr);
    /* This only occurs when y1 == -y2 and x1^3 == x2^3, but x1 != x2.
     * This means either x1 == beta*x2 or beta*x1 == x2, where beta is
     * a nontrivial cube root of one. In either case, an alternate
     * non-indeterminate expression for lambda is (y1 - y2)/(x1 - x2),
     * so we set R/M equal to this. */
    rr_alt = s1;
    secp256k1_fe_mul_int(&rr_alt, 2);       /* rr = Y1*Z2^3 - Y2*Z1^3 (2) */
    secp256k1_fe_add(&m_alt, &u1);          /* Malt = X1*Z2^2 - X2*Z1^2 */

    secp256k1_fe_cmov(&rr_alt, &rr, !degenerate);
    secp256k1_fe_cmov(&m_alt, &m, !degenerate);
    /* Now Ralt / Malt = lambda and is guaranteed not to be 0/0.
     * From here on out Ralt and Malt represent the numerator
     * and denominator of lambda; R and M represent the explicit
     * expressions x1^2 + x2^2 + x1x2 and y1 + y2. */
    secp256k1_fe_sqr(&n, &m_alt);                       /* n = Malt^2 (1) */
    secp256k1_fe_mul(&q, &n, &t);                       /* q = Q = T*Malt^2 (1) */
    /* These two lines use the observation that either M == Malt or M == 0,
     * so M^3 * Malt is either Malt^4 (which is computed by squaring), or
     * zero (which is "computed" by cmov). So the cost is one squaring
     * versus two multiplications. */
    secp256k1_fe_sqr(&n, &n);
    secp256k1_fe_cmov(&n, &m, degenerate);              /* n = M^3 * Malt (2) */
    secp256k1_fe_sqr(&t, &rr_alt);                      /* t = Ralt^2 (1) */
    secp256k1_fe_mul(&r->z, &a->z, &m_alt);             /* r->z = Malt*Z (1) */
    infinity = secp256k1_fe_normalizes_to_zero(&r->z) * (1 - a->infinity);
    secp256k1_fe_mul_int(&r->z, 2);                     /* r->z = Z3 = 2*Malt*Z (2) */
    secp256k1_fe_negate(&q, &q, 1);                     /* q = -Q (2) */
    secp256k1_fe_add(&t, &q);                           /* t = Ralt^2-Q (3) */
    secp256k1_fe_normalize_weak(&t);
    r->x = t;                                           /* r->x = Ralt^2-Q (1) */
    secp256k1_fe_mul_int(&t, 2);                        /* t = 2*x3 (2) */
    secp256k1_fe_add(&t, &q);                           /* t = 2*x3 - Q: (4) */
    secp256k1_fe_mul(&t, &t, &rr_alt);                  /* t = Ralt*(2*x3 - Q) (1) */
    secp256k1_fe_add(&t, &n);                           /* t = Ralt*(2*x3 - Q) + M^3*Malt (3) */
    secp256k1_fe_negate(&r->y, &t, 3);                  /* r->y = Ralt*(Q - 2x3) - M^3*Malt (4) */
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_mul_int(&r->x, 4);                     /* r->x = X3 = 4*(Ralt^2-Q) */
    secp256k1_fe_mul_int(&r->y, 4);                     /* r->y = Y3 = 4*Ralt*(Q - 2x3) - 4*M^3*Malt (4) */

    /** In case a->infinity == 1, replace r with (b->x, b->y, 1). */
    secp256k1_fe_cmov(&r->x, &b->x, a->infinity);
    secp256k1_fe_cmov(&r->y, &b->y, a->infinity);
    secp256k1_fe_cmov(&r->z, &fe_1, a->infinity);
    r->infinity = infinity;
}